

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O0

bool glcts::checkResults<int>
               (Context *context,GLuint copy_po_id,GLuint id,GLuint width,GLuint height,GLuint depth
               ,GLuint components,GLenum format,GLenum type,STORAGE_TYPE storType,int *expectedData)

{
  code *pcVar1;
  byte bVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLboolean GVar5;
  int iVar6;
  deUint32 dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar9;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  undefined8 in_stack_fffffffffffffcd8;
  undefined4 uVar11;
  char **local_2f8;
  char *local_2a0;
  char *local_298;
  char *local_200;
  MessageBuilder local_1f8;
  int *local_78;
  int *pointer;
  byte local_65;
  GLuint i;
  undefined4 uStack_60;
  bool result;
  GLuint uint_tex_id;
  GLint old_program;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> resultData;
  Functions *gl;
  GLuint local_20;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  GLuint id_local;
  GLuint copy_po_id_local;
  Context *context_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  gl._4_4_ = depth;
  local_20 = height;
  depth_local = width;
  height_local = id;
  width_local = copy_po_id;
  _id_local = context;
  pRVar8 = deqp::Context::getRenderContext(context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar6);
  iVar6 = depth_local * local_20;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(ulong)(iVar6 * components),&local_49);
  std::allocator<int>::~allocator(&local_49);
  uStack_60 = 0;
  i = 0;
  if (type == 0x1406) {
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x1be))(1,&i);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error generating temporary texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x9d);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x2e))(0xde1,i);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error binding temporary texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa1);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x4e0))
              (0xde1,1,0x8d70,depth_local,local_20);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error allocating temporary texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa3);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x4d8))(0xde1,0x2800,0x2600);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error setting texture object\'s filter mode!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa7);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x4d8))(0xde1,0x2801,0x2600);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error setting texture object\'s filter mode!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xa9);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x1a8))(0x8ca8,0x8ce0,0xde1,i,0);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error attaching texture to frame buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xad);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x20))
              (1,i,0,0,0,0x88b9,CONCAT44(uVar11,0x8d70));
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error binding integer texture for copy destination",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xb1);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x21a))
              (0x8b8d,&stack0xffffffffffffffa0);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error querying old program!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xb5);
    (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x5a0))(width_local);
    dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar7,"Error setting active program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0xb7);
  }
  local_65 = 1;
  pointer._4_4_ = 0;
  do {
    if (gl._4_4_ <= pointer._4_4_) {
LAB_016543e8:
      if (type == 0x1406) {
        (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 0x5a0))(uStack_60);
        dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0x200))();
        glu::checkError(dVar7,"Error setting active program object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                        ,0xed);
        (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 0x120))(1,&i);
        dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0x200))();
        glu::checkError(dVar7,"Error deleting temporary texture!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                        ,0xf1);
      }
      bVar2 = local_65;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
      return (bool)(bVar2 & 1);
    }
    if (type == 0x1406) {
      (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x20))
                (0,height_local,0,0,pointer._4_4_,35000,0x8814);
      dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar7,"Error binding floating point texture for copy source",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xc3);
      (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x14a))(depth_local,local_20,1);
      dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar7,"Error dispatching float-to-integer compute shader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xc5);
      GVar4 = depth_local;
      GVar3 = local_20;
      pcVar1 = *(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x488);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,0);
      (*pcVar1)(0,0,GVar4,GVar3,0x8d99,0x1405,pvVar9);
      dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar7,"Error reading pixels from frame buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xc9);
    }
    else {
      (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x1ae))
                (0x8ca8,0x8ce0,height_local,0,pointer._4_4_);
      dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar7,"Error attaching texture to frame buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xcf);
      GVar4 = depth_local;
      GVar3 = local_20;
      pcVar1 = *(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x488);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,0);
      (*pcVar1)(0,0,GVar4,GVar3,format,type,pvVar9);
      dVar7 = (**(code **)(resultData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar7,"Error reading pixels from frame buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0xd3);
    }
    local_78 = expectedData + pointer._4_4_ * depth_local * local_20 * components;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,0);
    GVar5 = areBuffersEqual<int>(pvVar9,local_78,depth_local * local_20 * components);
    if (GVar5 == '\0') {
      this = deqp::Context::getTestContext(_id_local);
      this_00 = tcu::TestContext::getLog(this);
      tcu::TestLog::operator<<(&local_1f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1f8,(char (*) [35])"Wrong value in result texture for ");
      if (type == 0x1406) {
        local_298 = "imageCubeArray";
      }
      else {
        if (type == 0x1404) {
          local_2a0 = "iimageCubeArray";
        }
        else {
          local_2a0 = "uimageCubeArray";
        }
        local_298 = local_2a0;
      }
      local_200 = local_298;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_200);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [27])" for resolution[w,h,d] = [")
      ;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&depth_local);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c5c975);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_20);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2c5c975);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(uint *)((long)&gl + 4));
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])"] for layer[");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(uint *)((long)&pointer + 4));
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [7])"] and ");
      if (storType == ST_MUTABLE) {
        local_2f8 = (char **)&TextureCubeMapArrayImageOpCompute::m_mutable_storage;
      }
      else {
        local_2f8 = &TextureCubeMapArrayImageOpCompute::m_immutable_storage;
      }
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,local_2f8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])0x2b1fadf);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f8);
      local_65 = 0;
      goto LAB_016543e8;
    }
    pointer._4_4_ = pointer._4_4_ + 1;
  } while( true );
}

Assistant:

bool checkResults(Context& context, glw::GLuint copy_po_id, glw::GLuint id, glw::GLuint width, glw::GLuint height,
				  glw::GLuint depth, glw::GLuint components, glw::GLenum format, glw::GLenum type,
				  STORAGE_TYPE storType, T* expectedData)
{
	/* Get GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* prepare buffers for result data */
	std::vector<T> resultData(width * height * components);

	glw::GLint  old_program = 0;
	glw::GLuint uint_tex_id = 0;

	/* Floating point textures are not renderable, so we will need to copy their bits to a temporary unsigned integer texture */
	if (type == GL_FLOAT)
	{
		/* Generate a new texture name */
		gl.genTextures(1, &uint_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating temporary texture object!");

		/* Allocate unsigned integer storage */
		gl.bindTexture(GL_TEXTURE_2D, uint_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding temporary texture object!");
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32UI, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating temporary texture object!");

		/* Set the filter mode */
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");

		/* Attach it to the framebuffer */
		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, uint_tex_id, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

		/* And bind it to an image unit for writing */
		gl.bindImageTexture(1, uint_tex_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding integer texture for copy destination");

		/* Finally, bind the copy compute shader */
		gl.getIntegerv(GL_CURRENT_PROGRAM, &old_program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error querying old program!");
		gl.useProgram(copy_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");
	}

	bool result = true;

	for (glw::GLuint i = 0; i < depth; ++i)
	{
		/* Floating point textures are not renderable */
		if (type == GL_FLOAT)
		{
			/* Use a compute shader to store the float bits as unsigned integers */
			gl.bindImageTexture(0, id, 0, GL_FALSE, i, GL_READ_ONLY, GL_RGBA32F);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding floating point texture for copy source");
			gl.dispatchCompute(width, height, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error dispatching float-to-integer compute shader");

			/* Read data as unsigned ints */
			gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &resultData[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels from frame buffer!");
		}
		else
		{
			/* Attach proper 2D texture to frame buffer and read pixels */
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, id, 0, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

			/* Read data */
			gl.readPixels(0, 0, width, height, format, type, &resultData[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels from frame buffer!");
		}

		/* Prepare correct pointer for expected data layer */
		T* pointer = &expectedData[0] + (i * width * height * components);

		/* If compared data are not equal log error and return false */
		if (!areBuffersEqual<T>(&resultData[0], pointer, width * height * components))
		{
			context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong value in result texture for "
				<< ((type == GL_FLOAT) ? "imageCubeArray" : ((type == GL_INT) ? "iimageCubeArray" : "uimageCubeArray"))
				<< " for resolution[w,h,d] = [" << width << "," << height << "," << depth << "] for layer[" << i
				<< "] and " << ((storType == ST_MUTABLE) ? TextureCubeMapArrayImageOpCompute::m_mutable_storage :
														   TextureCubeMapArrayImageOpCompute::m_immutable_storage)
				<< " storage!" << tcu::TestLog::EndMessage;
			result = false;
			break;
		}
	}

	/* Clean up the floating point stuff */
	if (type == GL_FLOAT)
	{
		/* Restore the program */
		gl.useProgram(old_program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

		/* Delete the temporary texture */
		gl.deleteTextures(1, &uint_tex_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error deleting temporary texture!");
	}

	return result;
}